

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::clear(Extractor *this)

{
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::clear
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x1732d6);
  return;
}

Assistant:

void Extractor::clear()
{
    d->blob_mats.clear();

#if NCNN_VULKAN
    if (d->opt.use_vulkan_compute)
    {
        d->blob_mats_gpu.clear();
        d->blob_mats_gpu_image.clear();

        if (d->local_blob_vkallocator)
        {
            d->net->vulkan_device()->reclaim_blob_allocator(d->local_blob_vkallocator);
            d->local_blob_vkallocator = 0;
        }
        if (d->local_staging_vkallocator)
        {
            d->net->vulkan_device()->reclaim_staging_allocator(d->local_staging_vkallocator);
            d->local_staging_vkallocator = 0;
        }
    }
#endif // NCNN_VULKAN
}